

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O2

void __thiscall spirv_cross::ParsedIR::remove_typed_id(ParsedIR *this,Types type,ID id)

{
  TypedID<(spirv_cross::Types)0> *pTVar1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *this_00;
  uint32_t local_c;
  
  this_00 = this->ids_for_type + type;
  pTVar1 = (this_00->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).ptr;
  local_c = id.id;
  pTVar1 = ::std::
           __remove_if<spirv_cross::TypedID<(spirv_cross::Types)0>*,__gnu_cxx::__ops::_Iter_equals_val<spirv_cross::TypedID<(spirv_cross::Types)0>const>>
                     (pTVar1,pTVar1 + this->ids_for_type[type].
                                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
                                      .buffer_size,(TypedID<(spirv_cross::Types)0> *)&local_c);
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::erase
            (this_00,pTVar1,
             (this_00->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).ptr +
             this->ids_for_type[type].super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
             .buffer_size);
  return;
}

Assistant:

void ParsedIR::remove_typed_id(Types type, ID id)
{
	auto &type_ids = ids_for_type[type];
	type_ids.erase(remove(begin(type_ids), end(type_ids), id), end(type_ids));
}